

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::dht_tracker::get_peers
          (dht_tracker *this,sha1_hash *ih,
          function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
          *f)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_50;
  code *local_40;
  
  p_Var1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      ::std::
      function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
      ::function((function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                  *)&local_50,f);
      local_68 = (code *)0x0;
      uStack_60 = 0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      dht::node::get_peers
                ((node *)&p_Var1[1]._M_left,ih,
                 (function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                  *)&local_50,
                 (function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
                  *)&local_78,(announce_flags_t)0x0);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void dht_tracker::get_peers(sha1_hash const& ih
		, std::function<void(std::vector<tcp::endpoint> const&)> f)
	{
		for (auto& n : m_nodes)
			n.second.dht.get_peers(ih, f, {}, {});
	}